

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neon_helper.c
# Opt level: O0

uint32_t helper_neon_sqadd_u32_aarch64(CPUARMState_conflict *env,uint32_t a,uint32_t b)

{
  int64_t op2;
  int64_t op1;
  int64_t res;
  uint32_t b_local;
  uint32_t a_local;
  CPUARMState_conflict *env_local;
  
  op1 = (ulong)a + (long)(int)b;
  if (op1 < 0x80000000) {
    if (op1 < -0x80000000) {
      (env->vfp).qc[0] = 1;
      op1 = -0x80000000;
    }
  }
  else {
    (env->vfp).qc[0] = 1;
    op1._0_4_ = 0x7fffffff;
  }
  return (uint32_t)op1;
}

Assistant:

uint32_t HELPER(neon_sqadd_u32)(CPUARMState *env, uint32_t a, uint32_t b)
{
    int64_t res;
    int64_t op1 = (uint32_t)a;
    int64_t op2 = (int32_t)b;
    res = op1 + op2;
    if (res > INT32_MAX) {
        SET_QC();
        res = INT32_MAX;
    } else if (res < INT32_MIN) {
        SET_QC();
        res = INT32_MIN;
    }
    return res;
}